

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::pushEncryptionFilter(QPDFWriter *this,PipelinePopper *pp)

{
  Count *pCVar1;
  Pipeline *pp_00;
  int key_len;
  element_type *peVar2;
  ulong uVar3;
  Pl_AES_PDF *pPVar4;
  uchar *puVar5;
  size_t key_bytes;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_40;
  unsigned_long local_38 [3];
  Pl_AES_PDF *local_20;
  Pipeline *p;
  PipelinePopper *pp_local;
  QPDFWriter *this_local;
  
  p = (Pipeline *)pp;
  pp_local = (PipelinePopper *)this;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->encrypted & 1U) != 0) {
    std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )this);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_20 = (Pl_AES_PDF *)0x0;
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      if ((peVar2->encrypt_use_aes & 1U) == 0) {
        pPVar4 = (Pl_AES_PDF *)operator_new(0x58);
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pCVar1 = peVar2->pipeline;
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        puVar5 = QUtil::unsigned_char_pointer(&peVar2->cur_data_key);
        std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
        local_38[0] = std::__cxx11::string::length();
        key_len = QIntC::to_int<unsigned_long>(local_38);
        Pl_RC4::Pl_RC4((Pl_RC4 *)pPVar4,"rc4 stream encryption",&pCVar1->super_Pipeline,puVar5,
                       key_len,0x10000);
        local_20 = pPVar4;
      }
      else {
        pPVar4 = (Pl_AES_PDF *)operator_new(0xa8);
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pCVar1 = peVar2->pipeline;
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        puVar5 = QUtil::unsigned_char_pointer(&peVar2->cur_data_key);
        std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
        key_bytes = std::__cxx11::string::length();
        Pl_AES_PDF::Pl_AES_PDF
                  (pPVar4,"aes stream encryption",&pCVar1->super_Pipeline,true,puVar5,key_bytes);
        local_20 = pPVar4;
      }
      pushPipeline(this,&local_20->super_Pipeline);
    }
  }
  pp_00 = p;
  std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>::
  unique_ptr<std::default_delete<qpdf::pl::Link>,void>
            ((unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>> *)&local_40,
             (nullptr_t)0x0);
  activatePipelineStack(this,(PipelinePopper *)pp_00,false,(string *)0x0,&local_40);
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_40);
  return;
}

Assistant:

void
QPDFWriter::pushEncryptionFilter(PipelinePopper& pp)
{
    if (m->encrypted && (!m->cur_data_key.empty())) {
        Pipeline* p = nullptr;
        if (m->encrypt_use_aes) {
            p = new Pl_AES_PDF(
                "aes stream encryption",
                m->pipeline,
                true,
                QUtil::unsigned_char_pointer(m->cur_data_key),
                m->cur_data_key.length());
        } else {
            p = new Pl_RC4(
                "rc4 stream encryption",
                m->pipeline,
                QUtil::unsigned_char_pointer(m->cur_data_key),
                QIntC::to_int(m->cur_data_key.length()));
        }
        pushPipeline(p);
    }
    // Must call this unconditionally so we can call popPipelineStack to balance
    // pushEncryptionFilter().
    activatePipelineStack(pp);
}